

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O2

void __thiscall
CVmImageWriter::write_entrypt
          (CVmImageWriter *this,uint32_t entry_ofs,size_t method_hdr_size,size_t exc_entry_size,
          size_t line_entry_size,size_t dbg_hdr_size,size_t dbg_lclsym_hdr_size,
          size_t dbg_frame_hdr_size,int dbg_vsn_id)

{
  uint16_t tmp_7;
  uint16_t tmp_5;
  char buf [32];
  
  buf._10_2_ = (undefined2)dbg_hdr_size;
  buf._8_2_ = (undefined2)line_entry_size;
  buf._6_2_ = (undefined2)exc_entry_size;
  buf._4_2_ = (undefined2)method_hdr_size;
  buf[0xc] = (char)dbg_lclsym_hdr_size;
  buf[0xd] = dbg_lclsym_hdr_size._1_1_;
  buf[0xe] = (char)dbg_vsn_id;
  buf[0xf] = dbg_vsn_id._1_1_;
  buf[0x10] = (char)dbg_frame_hdr_size;
  buf[0x11] = dbg_frame_hdr_size._1_1_;
  buf._0_4_ = entry_ofs;
  begin_block(this,"ENTP",1);
  CVmFile::write_bytes(this->fp_,buf,0x12);
  end_block(this);
  return;
}

Assistant:

void CVmImageWriter::write_entrypt(uint32_t entry_ofs, size_t method_hdr_size,
                                   size_t exc_entry_size,
                                   size_t line_entry_size,
                                   size_t dbg_hdr_size,
                                   size_t dbg_lclsym_hdr_size,
                                   size_t dbg_frame_hdr_size,
                                   int dbg_vsn_id)
{
    char buf[32];
    
    /* prepare the block's contents */
    oswp4(buf, entry_ofs);
    oswp2(buf+4, method_hdr_size);
    oswp2(buf+6, exc_entry_size);
    oswp2(buf+8, line_entry_size);
    oswp2(buf+10, dbg_hdr_size);
    oswp2(buf+12, dbg_lclsym_hdr_size);
    oswp2(buf+14, dbg_vsn_id);
    oswp2(buf+16, dbg_frame_hdr_size);

    /* open the block, write the data, and close the block */
    begin_block("ENTP", TRUE);
    fp_->write_bytes(buf, 18);
    end_block();
}